

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O2

shared_ptr<helics::Broker>
helics::BrokerFactory::create(CoreType type,string_view brokerName,int argc,char **argv)

{
  element_type *peVar1;
  bool bVar2;
  RegistrationFailure *this;
  char *pcVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CoreType type_00;
  undefined4 in_register_0000003c;
  shared_ptr<helics::Broker> *broker;
  string_view name;
  string_view message;
  shared_ptr<helics::Broker> sVar4;
  CoreType newType;
  string newName;
  undefined1 local_68 [40];
  string *local_40;
  CoreType *local_38;
  
  broker = (shared_ptr<helics::Broker> *)CONCAT44(in_register_0000003c,type);
  pcVar3 = brokerName._M_str;
  type_00 = (CoreType)brokerName._M_len;
  newName._M_dataplus._M_p = (pointer)&newName.field_2;
  newName._M_string_length = 0;
  newName.field_2._M_local_buf[0] = '\0';
  if (pcVar3 == (char *)0x0 || type_00 == EXTRACT) {
    helics::core::extractCoreType_abi_cxx11_(newType,(char **)newName._M_dataplus._M_p);
    local_40 = &newName;
    local_38 = &newType;
    std::tuple<helics::CoreType&,std::__cxx11::string&>::operator=
              ((tuple<helics::CoreType&,std::__cxx11::string&> *)&local_40,
               (pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_68);
    std::__cxx11::string::~string((string *)(local_68 + 8));
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)newName._M_string_length;
    }
    if (type_00 == EXTRACT) {
      type_00 = newType;
    }
  }
  name._M_len = (ulong)type_00;
  name._M_str = pcVar3;
  makeBroker(type,name);
  peVar1 = (broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_Broker[9])(peVar1,(ulong)argv & 0xffffffff);
  bVar2 = registerBroker(broker,type_00);
  if (!bVar2) {
    this = (RegistrationFailure *)__cxa_allocate_exception(0x28);
    message._M_str = "unable to register broker";
    message._M_len = 0x19;
    RegistrationFailure::RegistrationFailure(this,message);
    __cxa_throw(this,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  (*((broker->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Broker
    [2])();
  std::__cxx11::string::~string((string *)&newName);
  sVar4.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)broker;
  return (shared_ptr<helics::Broker>)
         sVar4.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Broker> create(CoreType type, std::string_view brokerName, int argc, char* argv[])
{
    std::string newName;
    CoreType newType;
    if (type == CoreType::EXTRACT || brokerName.empty()) {
        std::tie(newType, newName) = core::extractCoreType(argc, argv);
        if (brokerName.empty() && !newName.empty()) {
            brokerName = newName;
        }
        if (type == CoreType::EXTRACT) {
            type = newType;
        }
    }
    auto broker = makeBroker(type, brokerName);
    broker->configureFromArgs(argc, argv);
    if (!registerBroker(broker, type)) {
        throw(helics::RegistrationFailure("unable to register broker"));
    }
    broker->connect();
    return broker;
}